

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::SharedCodeGenerator
          (SharedCodeGenerator *this,FileDescriptor *file,Options *options)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false> this_00;
  
  this_00._M_head_impl = (ClassNameResolver *)operator_new(0x30);
  ClassNameResolver::ClassNameResolver(this_00._M_head_impl);
  (this->name_resolver_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>._M_head_impl
       = this_00._M_head_impl;
  this->file_ = file;
  bVar2 = options->generate_mutable_code;
  bVar3 = options->generate_shared_code;
  bVar4 = options->enforce_lite;
  (this->options_).generate_immutable_code = options->generate_immutable_code;
  (this->options_).generate_mutable_code = bVar2;
  (this->options_).generate_shared_code = bVar3;
  (this->options_).enforce_lite = bVar4;
  (this->options_).annotate_code = options->annotate_code;
  (this->options_).annotation_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_list_file.field_2;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_list_file,pcVar1,
             pcVar1 + (options->annotation_list_file)._M_string_length);
  (this->options_).output_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).output_list_file.field_2;
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_list_file,pcVar1,
             pcVar1 + (options->output_list_file)._M_string_length);
  return;
}

Assistant:

SharedCodeGenerator::SharedCodeGenerator(const FileDescriptor* file,
                                         const Options& options)
    : name_resolver_(new ClassNameResolver), file_(file), options_(options) {}